

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

baseHolder * __thiscall
cs_impl::any::holder<std::shared_ptr<cs::context_type>_>::duplicate
          (holder<std::shared_ptr<cs::context_type>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  baseHolder *pbVar2;
  
  if ((DAT_00269188 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x18);
  }
  else {
    pbVar2 = *(baseHolder **)
              (&holder<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                ::allocator + DAT_00269188 * 8);
    DAT_00269188 = DAT_00269188 + -1;
  }
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__holder_0025e1f0;
  pbVar2[1]._vptr_baseHolder =
       (_func_int **)
       (this->mDat).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->mDat).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  pbVar2[2]._vptr_baseHolder = (_func_int **)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return pbVar2;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}